

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O0

void __thiscall
QOffscreenBackingStore::flush
          (QOffscreenBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  bool bVar1;
  int aheight;
  int awidth;
  QRect *pQVar2;
  QOffscreenBackingStore **ppQVar3;
  QSize *in_RCX;
  QOffscreenBackingStore *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  WId id;
  QRect bounds;
  QRegion clipped;
  QSize imageSize;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QPoint *in_stack_ffffffffffffff80;
  QRect *in_stack_ffffffffffffff88;
  undefined8 local_68;
  undefined8 local_60;
  QRect local_40;
  undefined1 local_30 [16];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QImage::size();
  bVar1 = QSize::isEmpty(in_RCX);
  if (!bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_18 = QImage::size();
    local_20 = 0xaaaaaaaaaaaaaaaa;
    aheight = QWindow::width((QWindow *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QWindow::height((QWindow *)CONCAT44(in_stack_ffffffffffffff4c,aheight));
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff4c,aheight);
    QRegion::QRegion((QRegion *)&local_20,local_30,0);
    awidth = QSize::width((QSize *)0x10d319);
    QSize::height((QSize *)0x10d32a);
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,awidth,aheight);
    operator-((QPoint *)in_RDI);
    local_40 = QRect::translated(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    QRegion::operator&=((QRegion *)&local_20,(QRect *)&local_40);
    pQVar2 = (QRect *)QRegion::boundingRect();
    QVar4 = QRect::translated(pQVar2,in_stack_ffffffffffffff80);
    bVar1 = QRect::isNull((QRect *)in_RDI);
    if (!bVar1) {
      QWindow::winId();
      pQVar2 = QHash<unsigned_long_long,_QRect>::operator[]
                         ((QHash<unsigned_long_long,_QRect> *)in_RCX,
                          (unsigned_long_long *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_68 = QVar4._0_8_;
      pQVar2->x1 = (Representation)(undefined4)local_68;
      pQVar2->y1 = (Representation)local_68._4_4_;
      local_60 = QVar4._8_8_;
      pQVar2->x2 = (Representation)(undefined4)local_60;
      pQVar2->y2 = (Representation)local_60._4_4_;
      ppQVar3 = QHash<unsigned_long_long,_QOffscreenBackingStore_*>::operator[]
                          ((QHash<unsigned_long_long,_QOffscreenBackingStore_*> *)in_RCX,
                           (unsigned_long_long *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *ppQVar3 = in_RDI;
    }
    QRegion::~QRegion((QRegion *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOffscreenBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(region);

    if (m_image.size().isEmpty())
        return;

    QSize imageSize = m_image.size();

    QRegion clipped = QRect(0, 0, window->width(), window->height());
    clipped &= QRect(0, 0, imageSize.width(), imageSize.height()).translated(-offset);

    QRect bounds = clipped.boundingRect().translated(offset);

    if (bounds.isNull())
        return;

    WId id = window->winId();

    m_windowAreaHash[id] = bounds;
    m_backingStoreForWinIdHash[id] = this;
}